

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

int Abc_SclHasDelayInfo(void *pScl)

{
  SC_Cell *pCell;
  SC_Timing *pSVar1;
  uint uVar2;
  
  uVar2 = 0;
  pCell = Abc_SclFindInvertor((SC_Lib *)pScl,0);
  if (pCell != (SC_Cell *)0x0) {
    pSVar1 = Scl_CellPinTime(pCell,0);
    uVar2 = (uint)(pSVar1 != (SC_Timing *)0x0);
  }
  return uVar2;
}

Assistant:

int Abc_SclHasDelayInfo( void * pScl )
{
    SC_Lib * p = (SC_Lib *)pScl;
    SC_Cell * pCell;
    SC_Timing * pTime;
    pCell = Abc_SclFindInvertor(p, 0);
    if ( pCell == NULL )
        return 0;
    pTime = Scl_CellPinTime( pCell, 0 );
    if ( pTime == NULL )
        return 0;
    return 1;
}